

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObjectPropertyEnumerator.cpp
# Opt level: O0

bool __thiscall
Js::DynamicObjectPropertyEnumerator::CanUseJITFastPath(DynamicObjectPropertyEnumerator *this)

{
  bool bVar1;
  CachedData **ppCVar2;
  ScriptContext *this_00;
  ThreadContext *this_01;
  bool local_19;
  DynamicObjectPropertyEnumerator *this_local;
  
  ppCVar2 = Memory::WriteBarrierPtr::operator_cast_to_CachedData__
                      ((WriteBarrierPtr *)&this->cachedData);
  if (*ppCVar2 != (CachedData *)0x0) {
    this_00 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->(&this->scriptContext);
    this_01 = ScriptContext::GetThreadContext(this_00);
    bVar1 = ThreadContext::IsRuntimeInTTDMode(this_01);
    if (bVar1) {
      TTDAbort_unrecoverable_error
                ("We should always have cachedData null if we are in record or replay mode");
    }
  }
  bVar1 = IsNullEnumerator(this);
  local_19 = false;
  if (!bVar1) {
    bVar1 = GetEnumNonEnumerable(this);
    local_19 = false;
    if (!bVar1) {
      ppCVar2 = Memory::WriteBarrierPtr::operator_cast_to_CachedData__
                          ((WriteBarrierPtr *)&this->cachedData);
      local_19 = *ppCVar2 != (CachedData *)0x0;
    }
  }
  return local_19;
}

Assistant:

bool DynamicObjectPropertyEnumerator::CanUseJITFastPath() const
    {
#if ENABLE_TTD
        TTDAssert(this->cachedData == nullptr || !this->scriptContext->GetThreadContext()->IsRuntimeInTTDMode(), "We should always have cachedData null if we are in record or replay mode");
#endif

        return !this->IsNullEnumerator() && !GetEnumNonEnumerable() && this->cachedData != nullptr;
    }